

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentwriter.cpp
# Opt level: O0

void __thiscall
QTextDocumentWriter::QTextDocumentWriter
          (QTextDocumentWriter *this,QIODevice *device,QByteArray *format)

{
  Data *qq;
  QByteArray *in_RDX;
  qsizetype in_RSI;
  QTextDocumentWriterPrivate *in_RDI;
  
  qq = (Data *)operator_new(0x30);
  QTextDocumentWriterPrivate::QTextDocumentWriterPrivate(in_RDI,(QTextDocumentWriter *)qq);
  (in_RDI->format).d.d = qq;
  (in_RDI->format).d.d[1].super_QArrayData.alloc = in_RSI;
  QByteArray::operator=((QByteArray *)(in_RDI->format).d.d,in_RDX);
  return;
}

Assistant:

QTextDocumentWriter::QTextDocumentWriter(QIODevice *device, const QByteArray &format)
    : d(new QTextDocumentWriterPrivate(this))
{
    d->device = device;
    d->format = format;
}